

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_836cd8::TLL::~TLL(TLL *this)

{
  cmTarget *this_00;
  bool bVar1;
  reference prop_00;
  undefined1 local_80 [47];
  allocator<char> local_51;
  string local_50;
  reference local_30;
  string *prop;
  iterator __end1;
  iterator __begin1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  TLL *this_local;
  
  __end1 = std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Props);
  prop = (string *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Props);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)&prop);
    if (!bVar1) break;
    prop_00 = std::__detail::
              _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ::operator*(&__end1);
    this_00 = this->Target;
    local_30 = prop_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"::@",&local_51);
    cmMakefile::GetBacktrace((cmMakefile *)local_80);
    std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
              ((optional<cmListFileBacktrace> *)(local_80 + 0x10),(cmListFileBacktrace *)local_80);
    cmTarget::AppendProperty
              (this_00,prop_00,&local_50,(optional<cmListFileBacktrace> *)(local_80 + 0x10),false);
    std::optional<cmListFileBacktrace>::~optional
              ((optional<cmListFileBacktrace> *)(local_80 + 0x10));
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    std::__detail::
    _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++(&__end1);
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&this->Props);
  std::__cxx11::string::~string((string *)&this->DirectoryId);
  return;
}

Assistant:

TLL::~TLL()
{
  for (std::string const& prop : this->Props) {
    this->Target->AppendProperty(prop, CMAKE_DIRECTORY_ID_SEP,
                                 this->Makefile.GetBacktrace());
  }
}